

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O3

void __thiscall
YAML::GraphBuilderAdapter::OnMapStart
          (GraphBuilderAdapter *this,Mark *mark,string *tag,anchor_t anchor,value param_4)

{
  iterator *piVar1;
  _Elt_pointer pCVar2;
  void *pvVar3;
  pointer ppvVar4;
  ContainerFrame local_28;
  
  pvVar3 = (void *)(**(code **)(*(long *)this->m_builder + 0x38))();
  local_28.pPrevKeyNode = this->m_pKeyNode;
  pCVar2 = (this->m_containers).c.
           super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_28.pContainer = pvVar3;
  if (pCVar2 == (this->m_containers).c.
                super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
    ::_M_push_back_aux<YAML::GraphBuilderAdapter::ContainerFrame>(&(this->m_containers).c,&local_28)
    ;
  }
  else {
    pCVar2->pContainer = pvVar3;
    pCVar2->pPrevKeyNode = local_28.pPrevKeyNode;
    piVar1 = &(this->m_containers).c.
              super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  this->m_pKeyNode = (void *)0x0;
  if (anchor != 0) {
    ppvVar4 = (this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppvVar4 >> 3) < anchor) {
      std::vector<void_*,_std::allocator<void_*>_>::resize(&(this->m_anchors).m_data,anchor);
      ppvVar4 = (this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                .super__Vector_impl_data._M_start;
    }
    ppvVar4[anchor - 1] = pvVar3;
  }
  return;
}

Assistant:

void GraphBuilderAdapter::OnMapStart(const Mark &mark, const std::string &tag,
                                     anchor_t anchor,
                                     EmitterStyle::value /* style */) {
  void *pNode = m_builder.NewMap(mark, tag, GetCurrentParent());
  m_containers.push(ContainerFrame(pNode, m_pKeyNode));
  m_pKeyNode = nullptr;
  RegisterAnchor(anchor, pNode);
}